

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  tftp_state_data *state;
  Curl_easy *data_00;
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  int iVar3;
  tftp_event_t tVar4;
  timediff_t tVar5;
  time_t tVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  undefined8 uVar13;
  curl_off_t cVar14;
  ulong maxlen;
  tftp_state_data *state_00;
  ushort *puVar15;
  ulong uVar16;
  bool bVar17;
  curl_off_t blksize;
  tftp_state_data *local_158;
  ushort *local_150;
  _Bool *local_148;
  socklen_t local_13c;
  char buffer [256];
  
  state = (data->conn->proto).tftpc;
  tVar5 = Curl_timeleft(state->data,(curltime *)0x0,state->state == TFTP_STATE_START);
  if (tVar5 < 0) {
    state->error = TFTP_ERR_TIMEOUT;
    state->state = TFTP_STATE_FIN;
  }
  else {
    tVar6 = time((time_t *)0x0);
    if ((long)state->retry_time + state->rx_time < tVar6) {
      tVar6 = time((time_t *)0x0);
      state->rx_time = tVar6;
      *done = false;
      CVar2 = tftp_state_machine(state,TFTP_EVENT_TIMEOUT);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      bVar17 = state->state == TFTP_STATE_FIN;
      *done = bVar17;
      goto joined_r0x00158491;
    }
  }
  *done = false;
  iVar3 = Curl_socket_check(state->sockfd,-1,-1,0);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(*piVar7,buffer,0x100);
    Curl_failf(data,"%s",pcVar8);
    state->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  state_00 = (data->conn->proto).tftpc;
  local_13c = 0x80;
  local_148 = done;
  sVar9 = recvfrom(state_00->sockfd,(state_00->rpacket).data,(ulong)state_00->blksize + 4,0,
                   (sockaddr *)&state_00->remote_addr,&local_13c);
  iVar3 = (int)sVar9;
  state_00->rbytes = iVar3;
  state_00->remote_addrlen = local_13c;
  if (iVar3 < 4) {
    Curl_failf(data,"Received too short packet");
    state_00->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar15 = (ushort *)(state_00->rpacket).data;
    tVar4 = (tftp_event_t)(ushort)(*puVar15 << 8 | *puVar15 >> 8);
    state_00->event = tVar4;
    switch(tVar4) {
    case TFTP_EVENT_DATA:
      if (((iVar3 != 4) &&
          ((ushort)((short)*(undefined4 *)&state_00->block + 1U) ==
           (ushort)(puVar15[1] << 8 | puVar15[1] >> 8))) &&
         (CVar2 = Curl_client_write(data,1,(char *)(puVar15 + 2),(ulong)(iVar3 - 4)),
         CVar2 != CURLE_OK)) {
        tftp_state_machine(state_00,TFTP_EVENT_ERROR);
        return CVar2;
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      state_00->error = (uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8);
      sVar10 = tftp_strnlen((char *)(puVar15 + 2),(ulong)(iVar3 - 4));
      if (((sVar10 < iVar3 - 4) && (((data->set).field_0x897 & 0x40) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"TFTP error: %s",puVar15 + 2);
      }
      break;
    case TFTP_EVENT_OACK:
      data_00 = state_00->data;
      state_00->blksize = 0x200;
      local_150 = (ushort *)((long)puVar15 + (ulong)(iVar3 - 2) + 2);
      local_158 = state_00;
      for (puVar15 = puVar15 + 1; puVar15 < local_150; puVar15 = (ushort *)((long)puVar15 + uVar16))
      {
        maxlen = (long)local_150 - (long)puVar15;
        sVar10 = tftp_strnlen((char *)puVar15,maxlen);
        uVar16 = sVar10 + 1;
        if (maxlen < uVar16 || maxlen - uVar16 == 0) {
LAB_0015849d:
          pcVar8 = "Malformed ACK packet, rejecting";
LAB_001584cb:
          Curl_failf(data_00,pcVar8);
          return CURLE_TFTP_ILLEGAL;
        }
        sVar11 = tftp_strnlen((char *)(uVar16 + (long)puVar15),maxlen - uVar16);
        uVar16 = sVar10 + sVar11 + 2;
        if (maxlen < uVar16) goto LAB_0015849d;
        sVar12 = strlen((char *)puVar15);
        buffer._0_8_ = (long)puVar15 + sVar12 + 1;
        if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x897 & 0x40) != 0)) &&
           ((pcVar1 = (data_00->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
            (0 < pcVar1->log_level)))) {
          Curl_infof(data_00,"got option=(%s) value=(%s)",puVar15);
        }
        iVar3 = curl_strnequal((char *)puVar15,"blksize",7);
        if (iVar3 == 0) {
          iVar3 = curl_strnequal((char *)puVar15,"tsize",5);
          state_00 = local_158;
          if (((iVar3 != 0) && (blksize = 0, ((data_00->state).field_0x7c0 & 8) == 0)) &&
             (iVar3 = Curl_str_number((char **)buffer,&blksize,0x7fffffffffffffff), iVar3 == 0)) {
            if (blksize == 0) {
              pcVar8 = "invalid tsize -:%s:- value in OACK packet";
              cVar14 = buffer._0_8_;
LAB_001584f8:
              Curl_failf(data_00,pcVar8,cVar14);
              return CURLE_TFTP_ILLEGAL;
            }
            if ((((data_00->set).field_0x897 & 0x40) != 0) &&
               ((pcVar1 = (data_00->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                (0 < pcVar1->log_level)))) {
              Curl_infof(data_00,"tsize parsed from OACK (%ld)");
            }
            Curl_pgrsSetDownloadSize(data_00,blksize);
          }
        }
        else {
          iVar3 = Curl_str_number((char **)buffer,&blksize,0xffb8);
          state_00 = local_158;
          if (iVar3 != 0) {
            pcVar8 = "blksize is larger than max supported";
            uVar13 = 0xffb8;
LAB_001584e8:
            Curl_failf(data_00,"%s (%d)",pcVar8,uVar13);
            return CURLE_TFTP_ILLEGAL;
          }
          if (blksize == 0) {
            pcVar8 = "invalid blocksize value in OACK packet";
            goto LAB_001584cb;
          }
          if (blksize < 8) {
            pcVar8 = "blksize is smaller than min supported";
            uVar13 = 8;
            goto LAB_001584e8;
          }
          if ((ulong)local_158->requested_blksize < (ulong)blksize) {
            pcVar8 = "server requested blksize larger than allocated (%ld)";
            cVar14 = blksize;
            goto LAB_001584f8;
          }
          local_158->blksize = (uint)blksize;
          if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x897 & 0x40) != 0)) &&
             ((pcVar1 = (data_00->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data_00,"blksize parsed from OACK (%d) requested (%d)");
          }
        }
      }
      break;
    default:
      Curl_failf(data,"%s","Internal error: Unexpected packet");
    }
    iVar3 = Curl_pgrsUpdate(data);
    if (iVar3 != 0) {
      tftp_state_machine(state_00,TFTP_EVENT_ERROR);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  CVar2 = tftp_state_machine(state,state->event);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  bVar17 = state->state == TFTP_STATE_FIN;
  *local_148 = bVar17;
joined_r0x00158491:
  if (bVar17) {
    Curl_xfer_setup_nop(data);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN);
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN);
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}